

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusGF.h
# Opt level: O2

int __thiscall ZXing::Pdf417::ModulusGF::multiply(ModulusGF *this,int a,int b)

{
  pointer psVar1;
  int iVar2;
  
  iVar2 = 0;
  if (b != 0 && a != 0) {
    psVar1 = (this->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (int)(this->_expTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)psVar1[a] + (long)psVar1[b]];
  }
  return iVar2;
}

Assistant:

int multiply(int a, int b) const {
		if (a == 0 || b == 0) {
			return 0;
		}
#ifdef ZX_REED_SOLOMON_USE_MORE_MEMORY_FOR_SPEED
		return _expTable[_logTable[a] + _logTable[b]];
#else
		return _expTable[fast_mod(_logTable[a] + _logTable[b], _modulus - 1)];
#endif
	}